

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O1

bool __thiscall bssl::ParseOCSPResponseData(bssl *this,Input raw_tlv,OCSPResponseData *out)

{
  iterator __position;
  Input input;
  bool bVar1;
  ResponderID *out_00;
  uint8_t *out_01;
  Input input_00;
  Input raw_tlv_00;
  bool version_present;
  Parser parser;
  Parser responses_parser;
  Input single_response;
  Input responder_input;
  Input version_input;
  Parser outer_parser;
  undefined1 local_99 [25];
  Parser local_80;
  Input local_68;
  Input local_58;
  Input local_48;
  Parser local_38;
  
  out_01 = (uint8_t *)raw_tlv.data_.size_;
  input_00.data_.size_ = (size_t)raw_tlv.data_.data_;
  input_00.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_38,input_00);
  der::Parser::Parser((Parser *)(local_99 + 1));
  bVar1 = der::Parser::ReadSequence(&local_38,(Parser *)(local_99 + 1));
  if ((bVar1) && (bVar1 = der::Parser::HasMore(&local_38), !bVar1)) {
    local_48.data_.data_ = (uchar *)0x0;
    local_48.data_.size_ = 0;
    out_00 = (ResponderID *)local_99;
    bVar1 = der::Parser::ReadOptionalTag
                      ((Parser *)(local_99 + 1),0xa0000000,&local_48,(bool *)out_00);
    if (bVar1) {
      if (local_99[0] == KEY_HASH) {
        input.data_.size_ = local_48.data_.size_;
        input.data_.data_ = local_48.data_.data_;
        der::Parser::Parser(&local_80,input);
        bVar1 = der::Parser::ReadUint8(&local_80,out_01);
        if (!bVar1) {
          return false;
        }
        bVar1 = der::Parser::HasMore(&local_80);
        if (bVar1) {
          return false;
        }
      }
      else {
        *out_01 = '\0';
      }
      if (*out_01 == '\0') {
        local_58.data_.data_ = (uchar *)0x0;
        local_58.data_.size_ = 0;
        bVar1 = der::Parser::ReadRawTLV((Parser *)(local_99 + 1),&local_58);
        if (((bVar1) &&
            (raw_tlv_00.data_.size_ = (size_t)(out_01 + 8),
            raw_tlv_00.data_.data_ = (uchar *)local_58.data_.size_,
            bVar1 = anon_unknown_20::ParseResponderID
                              ((anon_unknown_20 *)local_58.data_.data_,raw_tlv_00,out_00), bVar1))
           && (bVar1 = der::Parser::ReadGeneralizedTime
                                 ((Parser *)(local_99 + 1),(GeneralizedTime *)(out_01 + 0x30)),
              bVar1)) {
          der::Parser::Parser(&local_80);
          bVar1 = der::Parser::ReadSequence((Parser *)(local_99 + 1),&local_80);
          if (bVar1) {
            if (*(long *)(out_01 + 0x40) != *(long *)(out_01 + 0x38)) {
              *(long *)(out_01 + 0x40) = *(long *)(out_01 + 0x38);
            }
            bVar1 = der::Parser::HasMore(&local_80);
            if (bVar1) {
              do {
                local_68.data_.data_ = (uchar *)0x0;
                local_68.data_.size_ = 0;
                bVar1 = der::Parser::ReadRawTLV(&local_80,&local_68);
                if (!bVar1) {
                  return false;
                }
                __position._M_current = *(Input **)(out_01 + 0x40);
                if (__position._M_current == *(Input **)(out_01 + 0x48)) {
                  ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
                  _M_realloc_insert<bssl::der::Input_const&>
                            ((vector<bssl::der::Input,std::allocator<bssl::der::Input>> *)
                             (out_01 + 0x38),__position,&local_68);
                }
                else {
                  ((__position._M_current)->data_).data_ = local_68.data_.data_;
                  ((__position._M_current)->data_).size_ = local_68.data_.size_;
                  *(long *)(out_01 + 0x40) = *(long *)(out_01 + 0x40) + 0x10;
                }
                bVar1 = der::Parser::HasMore(&local_80);
              } while (bVar1);
            }
            bVar1 = der::Parser::ReadOptionalTag
                              ((Parser *)(local_99 + 1),0xa0000001,(Input *)(out_01 + 0x58),
                               (bool *)(out_01 + 0x50));
            if (bVar1) {
              bVar1 = der::Parser::HasMore((Parser *)(local_99 + 1));
              return !bVar1;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ParseOCSPResponseData(der::Input raw_tlv, OCSPResponseData *out) {
  der::Parser outer_parser(raw_tlv);
  der::Parser parser;
  if (!outer_parser.ReadSequence(&parser)) {
    return false;
  }
  if (outer_parser.HasMore()) {
    return false;
  }

  der::Input version_input;
  bool version_present;
  if (!parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0, &version_input,
          &version_present)) {
    return false;
  }

  // For compatibilty, we ignore the restriction from X.690 Section 11.5 that
  // DEFAULT values should be omitted for values equal to the default value.
  // TODO: Add warning about non-strict parsing.
  if (version_present) {
    der::Parser version_parser(version_input);
    if (!version_parser.ReadUint8(&(out->version))) {
      return false;
    }
    if (version_parser.HasMore()) {
      return false;
    }
  } else {
    out->version = 0;
  }

  if (out->version != 0) {
    return false;
  }

  der::Input responder_input;
  if (!parser.ReadRawTLV(&responder_input)) {
    return false;
  }
  if (!ParseResponderID(responder_input, &(out->responder_id))) {
    return false;
  }
  if (!parser.ReadGeneralizedTime(&(out->produced_at))) {
    return false;
  }

  der::Parser responses_parser;
  if (!parser.ReadSequence(&responses_parser)) {
    return false;
  }
  out->responses.clear();
  while (responses_parser.HasMore()) {
    der::Input single_response;
    if (!responses_parser.ReadRawTLV(&single_response)) {
      return false;
    }
    out->responses.push_back(single_response);
  }

  if (!parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 1,
          &(out->extensions), &(out->has_extensions))) {
    return false;
  }

  return !parser.HasMore();
}